

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O2

void __thiscall SDLFB::UpdateColors(SDLFB *this)

{
  int i;
  long lVar1;
  PalEntry palette [256];
  PalEntry local_408 [256];
  
  if (this->NotPaletted == true) {
    for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
      local_408[lVar1].field_0.field_0.r =
           this->GammaTable[0][this->SourcePalette[lVar1].field_0.field_0.r];
      local_408[lVar1].field_0.field_0.g =
           this->GammaTable[1][this->SourcePalette[lVar1].field_0.field_0.g];
      local_408[lVar1].field_0.field_0.b =
           this->GammaTable[2][this->SourcePalette[lVar1].field_0.field_0.b];
    }
    if (this->FlashAmount != 0) {
      DoBlending(local_408,local_408,0x100,
                 (uint)this->GammaTable[0][(this->Flash).field_0.field_0.r],
                 (uint)this->GammaTable[1][(this->Flash).field_0.field_0.g],
                 (uint)this->GammaTable[2][(this->Flash).field_0.field_0.b],this->FlashAmount);
    }
    (*GPfx.SetPalette)(local_408);
  }
  else {
    for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
      local_408[lVar1].field_0.field_0.b =
           this->GammaTable[0][this->SourcePalette[lVar1].field_0.field_0.r];
      local_408[lVar1].field_0.field_0.g =
           this->GammaTable[1][this->SourcePalette[lVar1].field_0.field_0.g];
      local_408[lVar1].field_0.field_0.r =
           this->GammaTable[2][this->SourcePalette[lVar1].field_0.field_0.b];
    }
    if (this->FlashAmount != 0) {
      DoBlending(local_408,local_408,0x100,
                 (uint)this->GammaTable[2][(this->Flash).field_0.field_0.b],
                 (uint)this->GammaTable[1][(this->Flash).field_0.field_0.g],
                 (uint)this->GammaTable[0][(this->Flash).field_0.field_0.r],this->FlashAmount);
    }
    SDL_SetPaletteColors(((this->field_8).Surface)->format->palette,local_408,0,0x100);
  }
  return;
}

Assistant:

void SDLFB::UpdateColors ()
{
	if (NotPaletted)
	{
		PalEntry palette[256];
		
		for (int i = 0; i < 256; ++i)
		{
			palette[i].r = GammaTable[0][SourcePalette[i].r];
			palette[i].g = GammaTable[1][SourcePalette[i].g];
			palette[i].b = GammaTable[2][SourcePalette[i].b];
		}
		if (FlashAmount)
		{
			DoBlending (palette, palette,
				256, GammaTable[0][Flash.r], GammaTable[1][Flash.g], GammaTable[2][Flash.b],
				FlashAmount);
		}
		GPfx.SetPalette (palette);
	}
	else
	{
		SDL_Color colors[256];
		
		for (int i = 0; i < 256; ++i)
		{
			colors[i].r = GammaTable[0][SourcePalette[i].r];
			colors[i].g = GammaTable[1][SourcePalette[i].g];
			colors[i].b = GammaTable[2][SourcePalette[i].b];
		}
		if (FlashAmount)
		{
			DoBlending ((PalEntry *)colors, (PalEntry *)colors,
				256, GammaTable[2][Flash.b], GammaTable[1][Flash.g], GammaTable[0][Flash.r],
				FlashAmount);
		}
		SDL_SetPaletteColors (Surface->format->palette, colors, 0, 256);
	}
}